

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  TestCaseInfo *other;
  IStreamingReporter *pIVar4;
  IConfig *pIVar5;
  undefined4 extraout_var;
  SectionTracker *pSVar6;
  IContext *pIVar7;
  byte local_3aa;
  byte local_39a;
  TestCaseStats local_340;
  NameAndLocation local_1c8;
  SectionTracker *local_198;
  ITracker *rootTracker;
  undefined1 local_180 [8];
  TestCaseInfo testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCase *testCase_local;
  RunContext *this_local;
  
  redirectedCout.field_2._8_8_ = (this->m_totals).assertions.passed;
  std::__cxx11::string::string((string *)(redirectedCerr.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&testInfo.properties);
  other = TestCase::getTestCaseInfo(testCase);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)local_180,other);
  pIVar4 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar4,local_180);
  this->m_activeTestCase = testCase;
  do {
    local_198 = (SectionTracker *)
                TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
    uVar2 = (*(local_198->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.
              super_IShared.super_NonCopyable._vptr_NonCopyable[0x10])();
    pSVar6 = local_198;
    if ((uVar2 & 1) == 0) {
      __assert_fail("rootTracker.isSectionTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/effolkronium[P]random/test/catch.hpp"
                    ,0x19cb,"Totals Catch::RunContext::runTest(const TestCase &)");
    }
    pIVar5 = Ptr<const_Catch::IConfig>::operator->(&this->m_config);
    iVar3 = (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0x11])();
    TestCaseTracking::SectionTracker::addInitialFilters
              (pSVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(extraout_var,iVar3));
    do {
      TestCaseTracking::TrackerContext::startCycle(&this->m_trackerContext);
      TestCaseTracking::NameAndLocation::NameAndLocation
                (&local_1c8,(string *)local_180,
                 (SourceLineInfo *)((long)&testInfo.tagsAsString.field_2 + 8));
      pSVar6 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_1c8);
      this->m_testCaseTracker = (ITracker *)pSVar6;
      TestCaseTracking::NameAndLocation::~NameAndLocation(&local_1c8);
      runCurrentTest(this,(string *)((long)&redirectedCerr.field_2 + 8),
                     (string *)&testInfo.properties);
      uVar2 = (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.
                super_NonCopyable._vptr_NonCopyable[6])();
      local_39a = 0;
      if ((uVar2 & 1) == 0) {
        iVar3 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xc])();
        local_39a = (byte)iVar3 ^ 0xff;
      }
    } while ((local_39a & 1) != 0);
    pIVar7 = getCurrentContext();
    uVar2 = (*pIVar7->_vptr_IContext[5])();
    local_3aa = 0;
    if ((uVar2 & 1) != 0) {
      iVar3 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xc])();
      local_3aa = (byte)iVar3 ^ 0xff;
    }
  } while ((local_3aa & 1) != 0);
  Totals::delta(__return_storage_ptr__,&this->m_totals,(Totals *)((long)&redirectedCout.field_2 + 8)
               );
  bVar1 = TestCaseInfo::expectedToFail((TestCaseInfo *)local_180);
  if ((bVar1) && ((__return_storage_ptr__->testCases).passed != 0)) {
    (__return_storage_ptr__->assertions).failed = (__return_storage_ptr__->assertions).failed + 1;
    (__return_storage_ptr__->testCases).passed = (__return_storage_ptr__->testCases).passed - 1;
    (__return_storage_ptr__->testCases).failed = (__return_storage_ptr__->testCases).failed + 1;
  }
  Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
  pIVar4 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  iVar3 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xc])();
  TestCaseStats::TestCaseStats
            (&local_340,(TestCaseInfo *)local_180,__return_storage_ptr__,
             (string *)((long)&redirectedCerr.field_2 + 8),(string *)&testInfo.properties,
             (bool)((byte)iVar3 & 1));
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar4,&local_340);
  TestCaseStats::~TestCaseStats(&local_340);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_180);
  std::__cxx11::string::~string((string *)&testInfo.properties);
  std::__cxx11::string::~string((string *)(redirectedCerr.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                ITracker& rootTracker = m_trackerContext.startRun();
                assert( rootTracker.isSectionTracker() );
                static_cast<SectionTracker&>( rootTracker ).addInitialFilters( m_config->getSectionsToRun() );
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, TestCaseTracking::NameAndLocation( testInfo.name, testInfo.lineInfo ) );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            if( testInfo.expectedToFail() && deltaTotals.testCases.passed > 0 ) {
                deltaTotals.assertions.failed++;
                deltaTotals.testCases.passed--;
                deltaTotals.testCases.failed++;
            }
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }